

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldriver.cpp
# Opt level: O0

QString * __thiscall
QSqlDriver::stripDelimiters(QSqlDriver *this,QString *identifier,IdentifierType type)

{
  ulong uVar1;
  undefined4 in_ECX;
  QString *in_RDX;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QString *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  QString::QString((QString *)0x12d109);
  uVar1 = (**(code **)(*in_RSI + 0xf0))(in_RSI,in_RDX,in_ECX);
  if ((uVar1 & 1) == 0) {
    QString::operator=(in_RDI,in_RDX);
  }
  else {
    QString::mid((longlong)local_20,(longlong)in_RDX);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x12d159);
    QString::chop((longlong)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QSqlDriver::stripDelimiters(const QString &identifier, IdentifierType type) const
{
    QString ret;
    if (isIdentifierEscaped(identifier, type)) {
        ret = identifier.mid(1);
        ret.chop(1);
    } else {
        ret = identifier;
    }
    return ret;
}